

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlsave.c
# Opt level: O3

void xmlDocDumpFormatMemoryEnc
               (xmlDocPtr out_doc,xmlChar **doc_txt_ptr,int *doc_txt_len,char *txt_encoding,
               int format)

{
  int code;
  xmlOutputBufferPtr out;
  size_t sVar1;
  xmlChar *pxVar2;
  xmlBufPtr buf;
  xmlBufPtr *ppxVar3;
  xmlNodePtr node;
  xmlCharEncodingHandlerPtr conv_hdlr;
  xmlCharEncodingHandler *local_c8;
  xmlSaveCtxt local_c0;
  
  local_c8 = (xmlCharEncodingHandlerPtr)0x0;
  if (doc_txt_ptr == (xmlChar **)0x0) {
    if (doc_txt_len != (int *)0x0) {
      *doc_txt_len = 0;
    }
  }
  else {
    *doc_txt_ptr = (xmlChar *)0x0;
    if (doc_txt_len != (int *)0x0) {
      *doc_txt_len = 0;
    }
    if (out_doc != (xmlDocPtr)0x0) {
      node = (xmlNodePtr)txt_encoding;
      if ((txt_encoding == (char *)0x0) &&
         (node = (xmlNodePtr)out_doc->encoding, node == (xmlNodePtr)0x0)) {
        node = (xmlNodePtr)0x0;
      }
      else {
        code = xmlOpenCharEncodingHandler((char *)node,1,&local_c8);
        if (code != 0) {
          xmlSaveErr((xmlOutputBufferPtr)0x0,code,node,txt_encoding);
          return;
        }
      }
      out = xmlAllocOutputBuffer(local_c8);
      if (out == (xmlOutputBufferPtr)0x0) {
        xmlRaiseMemoryError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,7,
                            (xmlError *)0x0);
      }
      else {
        memset(&local_c0,0,0x90);
        local_c0.encoding = (xmlChar *)node;
        local_c0.buf = out;
        xmlSaveCtxtInit(&local_c0,0x21 - (uint)(format == 0));
        xmlDocContentDumpOutput(&local_c0,out_doc);
        xmlOutputBufferFlush(out);
        if (out->error == 0) {
          buf = out->conv;
          if (buf == (xmlBufPtr)0x0) {
            ppxVar3 = &out->buffer;
            buf = out->buffer;
          }
          else {
            ppxVar3 = &out->conv;
          }
          sVar1 = xmlBufUse(buf);
          if (doc_txt_len != (int *)0x0) {
            *doc_txt_len = (int)sVar1;
          }
          pxVar2 = xmlBufDetach(*ppxVar3);
          *doc_txt_ptr = pxVar2;
        }
        xmlOutputBufferClose(out);
      }
    }
  }
  return;
}

Assistant:

void
xmlDocDumpFormatMemoryEnc(xmlDocPtr out_doc, xmlChar **doc_txt_ptr,
		int * doc_txt_len, const char * txt_encoding,
		int format) {
    xmlSaveCtxt ctxt;
    int options;
    int                         dummy = 0;
    xmlOutputBufferPtr          out_buff = NULL;
    xmlCharEncodingHandlerPtr   conv_hdlr = NULL;

    if (doc_txt_len == NULL) {
        doc_txt_len = &dummy;   /*  Continue, caller just won't get length */
    }

    if (doc_txt_ptr == NULL) {
        *doc_txt_len = 0;
        return;
    }

    *doc_txt_ptr = NULL;
    *doc_txt_len = 0;

    if (out_doc == NULL) {
        /*  No document, no output  */
        return;
    }

    /*
     *  Validate the encoding value, if provided.
     *  This logic is copied from xmlSaveFileEnc.
     */

    if (txt_encoding == NULL)
	txt_encoding = (const char *) out_doc->encoding;
    if (txt_encoding != NULL) {
        int res;

	res = xmlOpenCharEncodingHandler(txt_encoding, /* output */ 1,
                                         &conv_hdlr);
	if (res != XML_ERR_OK) {
            xmlSaveErr(NULL, res, NULL, txt_encoding);
	    return;
	}
    }

    out_buff = xmlAllocOutputBuffer(conv_hdlr);
    if (out_buff == NULL ) {
        xmlSaveErrMemory(NULL);
        return;
    }

    memset(&ctxt, 0, sizeof(ctxt));
    ctxt.buf = out_buff;
    ctxt.level = 0;
    ctxt.encoding = (const xmlChar *) txt_encoding;

    options = XML_SAVE_AS_XML;
    if (format)
        options |= XML_SAVE_FORMAT;
    xmlSaveCtxtInit(&ctxt, options);

    xmlDocContentDumpOutput(&ctxt, out_doc);
    xmlOutputBufferFlush(out_buff);

    if (!out_buff->error) {
        if (out_buff->conv != NULL) {
            *doc_txt_len = xmlBufUse(out_buff->conv);
            *doc_txt_ptr = xmlBufDetach(out_buff->conv);
        } else {
            *doc_txt_len = xmlBufUse(out_buff->buffer);
            *doc_txt_ptr = xmlBufDetach(out_buff->buffer);
        }
    }

    xmlOutputBufferClose(out_buff);
}